

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O2

void __thiscall OPN2::setPatch(OPN2 *this,size_t c,OpnTimbre *instrument)

{
  uint8_t *puVar1;
  pointer pOVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong chip;
  long lVar10;
  OpnTimbre *pOVar11;
  long lVar12;
  uint32_t uVar13;
  uint32_t index;
  bool port;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = c;
  chip = c / 6;
  lVar10 = 0;
  iVar5 = SUB164(auVar4 % ZEXT816(6),0);
  port = 2 < SUB168(auVar4 % ZEXT816(6),0);
  iVar6 = iVar5 + -3;
  if (!port) {
    iVar6 = iVar5;
  }
  pOVar2 = (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = *(undefined8 *)instrument->OPS;
  uVar8 = *(undefined8 *)(instrument->OPS[1].data + 1);
  uVar9 = *(undefined8 *)(instrument->OPS[3].data + 3);
  puVar1 = pOVar2[c].OPS[2].data + 2;
  *(undefined8 *)puVar1 = *(undefined8 *)(instrument->OPS[2].data + 2);
  *(undefined8 *)(puVar1 + 8) = uVar9;
  pOVar2 = pOVar2 + c;
  *(undefined8 *)pOVar2->OPS = uVar7;
  *(undefined8 *)(pOVar2->OPS[1].data + 1) = uVar8;
  uVar13 = iVar6 + 0x30;
  pOVar11 = instrument;
  for (; lVar10 != 7; lVar10 = lVar10 + 1) {
    index = uVar13;
    for (lVar12 = 0; lVar12 != 0x1c; lVar12 = lVar12 + 7) {
      writeRegI(this,chip,port,index,(uint)pOVar11->OPS[0].data[lVar12]);
      index = index + 4;
    }
    uVar13 = uVar13 + 0x10;
    pOVar11 = (OpnTimbre *)(pOVar11->OPS[0].data + 1);
  }
  writeRegI(this,chip,port,iVar6 + 0xb0,(uint)instrument->fbalg);
  puVar3 = (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3[c] = instrument->lfosens & 0x3f | puVar3[c] & 0xc0;
  writeRegI(this,chip,port,iVar6 + 0xb4,
            (uint)(this->m_regLFOSens).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[c]);
  return;
}

Assistant:

void OPN2::setPatch(size_t c, const OpnTimbre &instrument)
{
    size_t      chip;
    uint8_t     port;
    uint32_t    cc;
    getOpnChannel(c, chip, port, cc);
    m_insCache[c] = instrument;
    for(uint8_t d = 0; d < 7; d++)
    {
        for(uint8_t op = 0; op < 4; op++)
            writeRegI(chip, port, 0x30 + (0x10 * d) + (op * 4) + cc, instrument.OPS[op].data[d]);
    }

    writeRegI(chip, port, 0xB0 + cc, instrument.fbalg);//Feedback/Algorithm
    m_regLFOSens[c] = (m_regLFOSens[c] & 0xC0) | (instrument.lfosens & 0x3F);
    writeRegI(chip, port, 0xB4 + cc, m_regLFOSens[c]);//Panorame and LFO bits
}